

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

void __thiscall Highs::Highs(Highs *this)

{
  undefined8 *in_RDI;
  HighsRanging *in_stack_ffffffffffffff50;
  HighsOptions *in_stack_ffffffffffffff60;
  PresolveComponent *this_00;
  HighsBasis *in_stack_ffffffffffffff70;
  HighsSparseMatrix *this_01;
  HighsTimer *in_stack_ffffffffffffff90;
  HEkk *this_02;
  
  *in_RDI = &PTR__Highs_0096d658;
  HighsSolution::HighsSolution((HighsSolution *)in_stack_ffffffffffffff50);
  HighsBasis::HighsBasis(in_stack_ffffffffffffff70);
  ICrashInfo::ICrashInfo((ICrashInfo *)in_stack_ffffffffffffff50);
  HighsModel::HighsModel((HighsModel *)in_stack_ffffffffffffff60);
  this_02 = (HEkk *)(in_RDI + 0xa4);
  std::vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>::vector
            ((vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_> *)0x4831c9);
  HighsModel::HighsModel((HighsModel *)in_stack_ffffffffffffff60);
  HighsTimer::HighsTimer(in_stack_ffffffffffffff90);
  HighsCallback::HighsCallback((HighsCallback *)in_stack_ffffffffffffff50);
  HighsOptions::HighsOptions(in_stack_ffffffffffffff60);
  HighsInfo::HighsInfo((HighsInfo *)in_stack_ffffffffffffff60);
  this_01 = (HighsSparseMatrix *)(in_RDI + 0x1ec);
  HighsRanging::HighsRanging(in_stack_ffffffffffffff50);
  HighsIis::HighsIis((HighsIis *)in_stack_ffffffffffffff50);
  this_00 = (PresolveComponent *)(in_RDI + 0x245);
  std::vector<HighsObjectiveSolution,_std::allocator<HighsObjectiveSolution>_>::vector
            ((vector<HighsObjectiveSolution,_std::allocator<HighsObjectiveSolution>_> *)0x48329b);
  *(undefined4 *)(in_RDI + 0x248) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x1244) = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x4832c8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x4832e1);
  HighsSparseMatrix::HighsSparseMatrix(this_01);
  HEkk::HEkk(this_02);
  HighsPresolveLog::HighsPresolveLog((HighsPresolveLog *)0x483330);
  *(undefined4 *)(in_RDI + 0x97f) = 0;
  *(undefined1 *)((long)in_RDI + 0x4bfc) = 1;
  *(undefined4 *)(in_RDI + 0x980) = 0;
  *(undefined1 *)((long)in_RDI + 0x4c04) = 0;
  PresolveComponent::PresolveComponent(this_00);
  return;
}

Assistant:

Highs::Highs() {}